

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResponseTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::net::http::Response_get_Test::Response_get_Test(Response_get_Test *this)

{
  Response_get_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Response_get_Test_003b1d60;
  return;
}

Assistant:

TEST(Response, get)
{
    IPAddress serverAddress;
    std::promise<void> started;

    std::thread clientThread([&serverAddress, &started]() {
        started.get_future().wait();
        get(URI::parse("http://" + serverAddress.authority()));
    });

    Socket socket;
    socket.open(AF_INET, SOCK_STREAM);
    socket.bind(IPAddress::v4("127.0.0.1", 0));
    socket.listen();

    ::sockaddr_storage addrStorage;
    ::socklen_t addrLen = sizeof(addrStorage);
    const auto returnCode = ::getsockname(
        socket.handle(), reinterpret_cast<::sockaddr*>(&addrStorage), &addrLen);
    ASSERT_EQ(0, returnCode);
    serverAddress = IPAddress(addrStorage, addrLen);

    started.set_value();

    auto clientSocket = socket.accept();
    std::array<char, 256> buffer;

    const auto numRead = read(clientSocket.handle(), &buffer[0], buffer.size());

    std::ostringstream oss;
    oss << "GET / HTTP/1.1\r\n"
           "Host: 127.0.0.1:"
        << serverAddress.port() << "\r\n"
        << "User-Agent: jaegertracing/" << kJaegerClientVersion << "\r\n\r\n";
    ASSERT_EQ(oss.str(), std::string(&buffer[0], numRead));

    oss.str("");
    oss.clear();

    std::string response("HTTP/1.1 200 OK\r\n\r\n");
    response.append(buffer.size() * 2, '0');
    const auto numWritten =
        ::send(clientSocket.handle(), response.c_str(), response.size(), 0);
    ASSERT_EQ(response.size(), numWritten);

    clientThread.join();
}